

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

uint8_t __thiscall
VmaAllocation_T::SwapBlockAllocation
          (VmaAllocation_T *this,VmaAllocator hAllocator,VmaAllocation allocation)

{
  VmaBlockMetadata *pVVar1;
  BlockAllocation *in_RDX;
  BlockAllocation *in_RDI;
  
  if (*(char *)((long)&in_RDI[4].m_AllocHandle + 6) != '\0') {
    VmaDeviceMemoryBlock::Unmap((VmaDeviceMemoryBlock *)this,hAllocator,allocation._4_4_);
  }
  pVVar1 = in_RDI->m_Block->m_pMetadata;
  (*pVVar1->_vptr_VmaBlockMetadata[0x16])(pVVar1,in_RDI->m_AllocHandle,in_RDX);
  std::swap<VmaAllocation_T::BlockAllocation>(in_RDI,in_RDX);
  pVVar1 = in_RDI->m_Block->m_pMetadata;
  (*pVVar1->_vptr_VmaBlockMetadata[0x16])(pVVar1,in_RDI->m_AllocHandle);
  std::swap<unsigned_int>((uint *)(in_RDI + 5),(uint *)(in_RDX + 5));
  return *(uint8_t *)((long)&in_RDI[4].m_AllocHandle + 6);
}

Assistant:

uint8_t VmaAllocation_T::SwapBlockAllocation(VmaAllocator hAllocator, VmaAllocation allocation)
{
    VMA_ASSERT(allocation != VMA_NULL);
    VMA_ASSERT(m_Type == ALLOCATION_TYPE_BLOCK);
    VMA_ASSERT(allocation->m_Type == ALLOCATION_TYPE_BLOCK);

    if (m_MapCount != 0)
        m_BlockAllocation.m_Block->Unmap(hAllocator, m_MapCount);

    m_BlockAllocation.m_Block->m_pMetadata->SetAllocationUserData(m_BlockAllocation.m_AllocHandle, allocation);
    VMA_SWAP(m_BlockAllocation, allocation->m_BlockAllocation);
    m_BlockAllocation.m_Block->m_pMetadata->SetAllocationUserData(m_BlockAllocation.m_AllocHandle, this);

#if VMA_STATS_STRING_ENABLED
    VMA_SWAP(m_BufferImageUsage, allocation->m_BufferImageUsage);
#endif
    return m_MapCount;
}